

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicHandleInfo.hpp
# Opt level: O3

void __thiscall
helics::BasicHandleInfo::BasicHandleInfo(BasicHandleInfo *this,BasicHandleInfo *param_1)

{
  pointer pcVar1;
  BaseType BVar2;
  BaseType BVar3;
  string *psVar4;
  InterfaceType IVar5;
  bool bVar6;
  uint16_t uVar7;
  
  BVar2 = (param_1->handle).handle.hid;
  BVar3 = (param_1->local_fed_id).fid;
  IVar5 = param_1->handleType;
  bVar6 = param_1->used;
  uVar7 = param_1->flags;
  (this->handle).fed_id.gid = (param_1->handle).fed_id.gid;
  (this->handle).handle.hid = BVar2;
  (this->local_fed_id).fid = BVar3;
  this->handleType = IVar5;
  this->used = bVar6;
  this->flags = uVar7;
  (this->key)._M_dataplus._M_p = (pointer)&(this->key).field_2;
  pcVar1 = (param_1->key)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->key,pcVar1,pcVar1 + (param_1->key)._M_string_length);
  (this->type)._M_dataplus._M_p = (pointer)&(this->type).field_2;
  pcVar1 = (param_1->type)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->type,pcVar1,pcVar1 + (param_1->type)._M_string_length);
  (this->units)._M_dataplus._M_p = (pointer)&(this->units).field_2;
  pcVar1 = (param_1->units)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->units,pcVar1,pcVar1 + (param_1->units)._M_string_length);
  psVar4 = param_1->type_out;
  this->type_in = param_1->type_in;
  this->type_out = psVar4;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&this->tags,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&param_1->tags);
  return;
}

Assistant:

BasicHandleInfo() noexcept: type_in(type), type_out(units) {}